

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSeparateShaderTests.cpp
# Opt level: O0

TestParams *
deqp::gles31::Functional::anon_unknown_0::genParams
          (TestParams *__return_storage_ptr__,deUint32 seed)

{
  bool bVar1;
  int iVar2;
  bool local_59;
  int local_58;
  bool local_4d;
  TestParams *params;
  int local_30;
  int i;
  int tryNdx;
  undefined1 local_1c [8];
  Random rnd;
  deUint32 seed_local;
  
  rnd.m_rnd.z = seed;
  de::Random::Random((Random *)local_1c,seed);
  TestParams::TestParams(__return_storage_ptr__);
  local_30 = 0;
  do {
    bVar1 = de::Random::getBool((Random *)local_1c);
    __return_storage_ptr__->initSingle = bVar1;
    bVar1 = de::Random::getBool((Random *)local_1c);
    __return_storage_ptr__->switchVtx = bVar1;
    bVar1 = de::Random::getBool((Random *)local_1c);
    __return_storage_ptr__->switchFrg = bVar1;
    bVar1 = de::Random::getBool((Random *)local_1c);
    __return_storage_ptr__->useUniform = bVar1;
    local_4d = false;
    if ((__return_storage_ptr__->useUniform & 1U) != 0) {
      local_4d = de::Random::getBool((Random *)local_1c);
    }
    __return_storage_ptr__->useProgramUniform = local_4d;
    bVar1 = de::Random::getBool((Random *)local_1c);
    __return_storage_ptr__->useCreateHelper = bVar1;
    bVar1 = de::Random::getBool((Random *)local_1c);
    __return_storage_ptr__->useSameName = bVar1;
    iVar2 = de::Random::getInt((Random *)local_1c,-1,3);
    if (iVar2 == -1) {
      local_58 = 0;
    }
    else {
      local_58 = 1 << ((byte)iVar2 & 0x1f);
    }
    (__return_storage_ptr__->varyings).count = local_58;
    if ((__return_storage_ptr__->varyings).count < 1) {
      (__return_storage_ptr__->varyings).type = TYPE_INVALID;
      (__return_storage_ptr__->varyings).binding = BINDING_LAST;
      (__return_storage_ptr__->varyings).vtxInterp = VARYINGINTERPOLATION_LAST;
      (__return_storage_ptr__->varyings).frgInterp = VARYINGINTERPOLATION_LAST;
    }
    else {
      (__return_storage_ptr__->varyings).type = TYPE_LAST;
      (__return_storage_ptr__->varyings).binding = BINDING_LAST;
      (__return_storage_ptr__->varyings).vtxInterp = VARYINGINTERPOLATION_RANDOM;
      (__return_storage_ptr__->varyings).frgInterp = VARYINGINTERPOLATION_RANDOM;
    }
    local_30 = local_30 + 1;
    bVar1 = paramsValid(__return_storage_ptr__);
    local_59 = !bVar1 && local_30 < 0x10;
  } while (local_59);
  de::Random::~Random((Random *)local_1c);
  return __return_storage_ptr__;
}

Assistant:

TestParams genParams (deUint32 seed)
{
	Random		rnd		(seed);
	TestParams	params;
	int			tryNdx	= 0;

	do
	{
		params.initSingle			= rnd.getBool();
		params.switchVtx			= rnd.getBool();
		params.switchFrg			= rnd.getBool();
		params.useUniform			= rnd.getBool();
		params.useProgramUniform	= params.useUniform && rnd.getBool();
		params.useCreateHelper		= rnd.getBool();
		params.useSameName			= rnd.getBool();
		{
			int i = rnd.getInt(-1, 3);
			params.varyings.count = (i == -1 ? 0 : 1 << i);
		}
		if (params.varyings.count > 0)
		{
			params.varyings.type		= glu::TYPE_LAST;
			params.varyings.binding		= BINDING_LAST;
			params.varyings.vtxInterp	= VARYINGINTERPOLATION_RANDOM;
			params.varyings.frgInterp	= VARYINGINTERPOLATION_RANDOM;
		}
		else
		{
			params.varyings.type		= glu::TYPE_INVALID;
			params.varyings.binding		= BINDING_LAST;
			params.varyings.vtxInterp	= VARYINGINTERPOLATION_LAST;
			params.varyings.frgInterp	= VARYINGINTERPOLATION_LAST;
		}

		tryNdx += 1;
	} while (!paramsValid(params) && tryNdx < 16);

	DE_ASSERT(paramsValid(params));

	return params;
}